

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

void __thiscall QDockAreaLayout::QDockAreaLayout(QDockAreaLayout *this,QMainWindow *win)

{
  int *piVar1;
  undefined8 *puVar2;
  QDockAreaLayoutItem *pQVar3;
  qsizetype qVar4;
  Data *pDVar5;
  int iVar6;
  long lVar7;
  QStyle *pQVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<QDockAreaLayoutItem> local_b8;
  int *local_a0;
  QArrayDataPointer<QWidget_*> local_98;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  QMainWindow *pQStack_68;
  QArrayDataPointer<QDockAreaLayoutItem> local_60;
  undefined1 local_48;
  undefined7 uStack_47;
  QTabBar *pQStack_40;
  int local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->rect).x1 = 0;
  (this->rect).y1 = 0;
  (this->rect).x2 = -1;
  (this->rect).y2 = -1;
  (this->centralWidgetRect).x1 = 0;
  (this->centralWidgetRect).y1 = 0;
  (this->centralWidgetRect).x2 = -1;
  (this->centralWidgetRect).y2 = -1;
  lVar7 = 0xa8;
  do {
    *(int **)((long)this->corners + lVar7 + -0x68) = &zero;
    puVar2 = (undefined8 *)((long)this->corners + lVar7 + -0x60);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2 = (undefined8 *)((long)this->corners + lVar7 + -0x54);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2 = (undefined8 *)((long)this->corners + lVar7 + -0x44);
    *puVar2 = 1;
    puVar2[1] = 0xffffffff00000000;
    *(undefined4 *)((long)this->corners + lVar7 + -0x34) = 0xffffffff;
    *(undefined8 *)((long)this->corners + lVar7 + -8) = 0;
    puVar2 = (undefined8 *)((long)this->corners + lVar7 + -0x30);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2 = (undefined8 *)((long)this->corners + lVar7 + -0x20);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined1 *)((long)this->corners + lVar7 + -0x10) = 0;
    *(undefined4 *)((long)this->corners + lVar7) = 1;
    lVar7 = lVar7 + 0x70;
  } while (lVar7 != 0x268);
  this->fallbackToSizeHints = true;
  (this->separatorWidgets).d.d = (Data *)0x0;
  (this->separatorWidgets).d.ptr = (QWidget **)0x0;
  (this->separatorWidgets).d.size = 0;
  this->mainWindow = win;
  pQVar8 = QWidget::style(&win->super_QWidget);
  iVar6 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x10,0,win);
  piVar1 = &this->sep;
  this->sep = iVar6;
  local_98.d = (Data *)0x0;
  local_98.ptr._0_4_ = 0;
  local_98.ptr._4_4_ = 0;
  local_98.size._0_4_ = 0;
  local_98.size._4_4_ = 0;
  local_80 = 0;
  uStack_7c = 2;
  uStack_78 = 0;
  uStack_74 = 0;
  uStack_70 = 0xffffffff;
  uStack_6c = 0xffffffff;
  pQStack_40 = (QTabBar *)0x0;
  local_60.d = (Data *)0x0;
  local_60.ptr._0_1_ = 0;
  local_60.ptr._1_7_ = 0;
  local_60.size._0_1_ = 0;
  local_60.size._1_7_ = 0;
  local_48 = 0;
  local_38 = 1;
  this->docks[0].sep = piVar1;
  local_a0 = piVar1;
  pQStack_68 = win;
  QArrayDataPointer<QWidget_*>::operator=(&this->docks[0].separatorWidgets.d,&local_98);
  pDVar5 = local_60.d;
  this->docks[0].rect.x2 = (Representation)uStack_70;
  this->docks[0].rect.y2 = (Representation)uStack_6c;
  this->docks[0].mainWindow = pQStack_68;
  this->docks[0].dockPos = local_80;
  this->docks[0].o = uStack_7c;
  this->docks[0].rect.x1 = (Representation)uStack_78;
  this->docks[0].rect.y1 = (Representation)uStack_74;
  pQVar3 = (QDockAreaLayoutItem *)CONCAT71(local_60.ptr._1_7_,local_60.ptr._0_1_);
  local_60.d = (Data *)0x0;
  qVar4 = CONCAT71(local_60.size._1_7_,(undefined1)local_60.size);
  local_60.ptr._0_1_ = 0;
  local_60.ptr._1_7_ = 0;
  local_60.size._0_1_ = 0;
  local_60.size._1_7_ = 0;
  local_b8.d = this->docks[0].item_list.d.d;
  local_b8.ptr = this->docks[0].item_list.d.ptr;
  this->docks[0].item_list.d.d = pDVar5;
  this->docks[0].item_list.d.ptr = pQVar3;
  local_b8.size = this->docks[0].item_list.d.size;
  this->docks[0].item_list.d.size = qVar4;
  QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_b8);
  this->docks[0].tabBarShape = local_38;
  *(ulong *)&this->docks[0].tabbed = CONCAT71(uStack_47,local_48);
  this->docks[0].tabBar = pQStack_40;
  QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_60);
  if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d)->super_QArrayData,8,0x10);
    }
  }
  local_98.d = (Data *)0x0;
  local_98.ptr._0_4_ = 0;
  local_98.ptr._4_4_ = 0;
  local_98.size._0_4_ = 0;
  local_98.size._4_4_ = 0;
  local_80 = 1;
  uStack_7c = 2;
  uStack_78 = 0;
  uStack_74 = 0;
  uStack_70 = 0xffffffff;
  uStack_6c = 0xffffffff;
  pQStack_40 = (QTabBar *)0x0;
  local_60.d = (Data *)0x0;
  local_60.ptr._0_1_ = 0;
  local_60.ptr._1_7_ = 0;
  local_60.size._0_1_ = 0;
  local_60.size._1_7_ = 0;
  local_48 = 0;
  local_38 = 1;
  this->docks[1].sep = piVar1;
  local_a0 = piVar1;
  pQStack_68 = win;
  QArrayDataPointer<QWidget_*>::operator=(&this->docks[1].separatorWidgets.d,&local_98);
  pDVar5 = local_60.d;
  this->docks[1].rect.x2 = (Representation)uStack_70;
  this->docks[1].rect.y2 = (Representation)uStack_6c;
  this->docks[1].mainWindow = pQStack_68;
  this->docks[1].dockPos = local_80;
  this->docks[1].o = uStack_7c;
  this->docks[1].rect.x1 = (Representation)uStack_78;
  this->docks[1].rect.y1 = (Representation)uStack_74;
  pQVar3 = (QDockAreaLayoutItem *)CONCAT71(local_60.ptr._1_7_,local_60.ptr._0_1_);
  local_60.d = (Data *)0x0;
  qVar4 = CONCAT71(local_60.size._1_7_,(undefined1)local_60.size);
  local_60.ptr._0_1_ = 0;
  local_60.ptr._1_7_ = 0;
  local_60.size._0_1_ = 0;
  local_60.size._1_7_ = 0;
  local_b8.d = this->docks[1].item_list.d.d;
  local_b8.ptr = this->docks[1].item_list.d.ptr;
  this->docks[1].item_list.d.d = pDVar5;
  this->docks[1].item_list.d.ptr = pQVar3;
  local_b8.size = this->docks[1].item_list.d.size;
  this->docks[1].item_list.d.size = qVar4;
  QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_b8);
  this->docks[1].tabBarShape = local_38;
  *(ulong *)&this->docks[1].tabbed = CONCAT71(uStack_47,local_48);
  this->docks[1].tabBar = pQStack_40;
  QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_60);
  if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d)->super_QArrayData,8,0x10);
    }
  }
  local_98.d = (Data *)0x0;
  local_98.ptr._0_4_ = 0;
  local_98.ptr._4_4_ = 0;
  local_98.size._0_4_ = 0;
  local_98.size._4_4_ = 0;
  local_80 = 2;
  uStack_7c = 1;
  uStack_78 = 0;
  uStack_74 = 0;
  uStack_70 = 0xffffffff;
  uStack_6c = 0xffffffff;
  pQStack_40 = (QTabBar *)0x0;
  local_60.d = (Data *)0x0;
  local_60.ptr._0_1_ = 0;
  local_60.ptr._1_7_ = 0;
  local_60.size._0_1_ = 0;
  local_60.size._1_7_ = 0;
  local_48 = 0;
  local_38 = 1;
  this->docks[2].sep = piVar1;
  local_a0 = piVar1;
  pQStack_68 = win;
  QArrayDataPointer<QWidget_*>::operator=(&this->docks[2].separatorWidgets.d,&local_98);
  pDVar5 = local_60.d;
  this->docks[2].rect.x2 = (Representation)uStack_70;
  this->docks[2].rect.y2 = (Representation)uStack_6c;
  this->docks[2].mainWindow = pQStack_68;
  this->docks[2].dockPos = local_80;
  this->docks[2].o = uStack_7c;
  this->docks[2].rect.x1 = (Representation)uStack_78;
  this->docks[2].rect.y1 = (Representation)uStack_74;
  pQVar3 = (QDockAreaLayoutItem *)CONCAT71(local_60.ptr._1_7_,local_60.ptr._0_1_);
  local_60.d = (Data *)0x0;
  qVar4 = CONCAT71(local_60.size._1_7_,(undefined1)local_60.size);
  local_60.ptr._0_1_ = 0;
  local_60.ptr._1_7_ = 0;
  local_60.size._0_1_ = 0;
  local_60.size._1_7_ = 0;
  local_b8.d = this->docks[2].item_list.d.d;
  local_b8.ptr = this->docks[2].item_list.d.ptr;
  this->docks[2].item_list.d.d = pDVar5;
  this->docks[2].item_list.d.ptr = pQVar3;
  local_b8.size = this->docks[2].item_list.d.size;
  this->docks[2].item_list.d.size = qVar4;
  QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_b8);
  this->docks[2].tabBarShape = local_38;
  *(ulong *)&this->docks[2].tabbed = CONCAT71(uStack_47,local_48);
  this->docks[2].tabBar = pQStack_40;
  QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_60);
  if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d)->super_QArrayData,8,0x10);
    }
  }
  local_98.d = (Data *)0x0;
  local_98.ptr._0_4_ = 0;
  local_98.ptr._4_4_ = 0;
  local_98.size._0_4_ = 0;
  local_98.size._4_4_ = 0;
  local_80 = 3;
  uStack_7c = 1;
  uStack_78 = 0;
  uStack_74 = 0;
  uStack_70 = 0xffffffff;
  uStack_6c = 0xffffffff;
  pQStack_40 = (QTabBar *)0x0;
  local_60.d = (Data *)0x0;
  local_60.ptr._0_1_ = 0;
  local_60.ptr._1_7_ = 0;
  local_60.size._0_1_ = 0;
  local_60.size._1_7_ = 0;
  local_48 = 0;
  local_38 = 1;
  this->docks[3].sep = piVar1;
  local_a0 = piVar1;
  pQStack_68 = win;
  QArrayDataPointer<QWidget_*>::operator=(&this->docks[3].separatorWidgets.d,&local_98);
  pDVar5 = local_60.d;
  this->docks[3].rect.x2 = (Representation)uStack_70;
  this->docks[3].rect.y2 = (Representation)uStack_6c;
  this->docks[3].mainWindow = pQStack_68;
  this->docks[3].dockPos = local_80;
  this->docks[3].o = uStack_7c;
  this->docks[3].rect.x1 = (Representation)uStack_78;
  this->docks[3].rect.y1 = (Representation)uStack_74;
  pQVar3 = (QDockAreaLayoutItem *)CONCAT71(local_60.ptr._1_7_,local_60.ptr._0_1_);
  local_60.d = (Data *)0x0;
  qVar4 = CONCAT71(local_60.size._1_7_,(undefined1)local_60.size);
  local_60.ptr._0_1_ = 0;
  local_60.ptr._1_7_ = 0;
  local_60.size._0_1_ = 0;
  local_60.size._1_7_ = 0;
  local_b8.d = this->docks[3].item_list.d.d;
  local_b8.ptr = this->docks[3].item_list.d.ptr;
  this->docks[3].item_list.d.d = pDVar5;
  this->docks[3].item_list.d.ptr = pQVar3;
  local_b8.size = this->docks[3].item_list.d.size;
  this->docks[3].item_list.d.size = qVar4;
  QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_b8);
  this->docks[3].tabBarShape = local_38;
  *(ulong *)&this->docks[3].tabbed = CONCAT71(uStack_47,local_48);
  this->docks[3].tabBar = pQStack_40;
  QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_60);
  if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d)->super_QArrayData,8,0x10);
    }
  }
  this->centralWidgetItem = (QLayoutItem *)0x0;
  this->corners[0] = TopDockWidgetArea;
  this->corners[1] = TopDockWidgetArea;
  this->corners[2] = BottomDockWidgetArea;
  this->corners[3] = BottomDockWidgetArea;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDockAreaLayout::QDockAreaLayout(QMainWindow *win) : fallbackToSizeHints(true)
{
    mainWindow = win;
    sep = win->style()->pixelMetric(QStyle::PM_DockWidgetSeparatorExtent, nullptr, win);
#if QT_CONFIG(tabbar)
    const int tabShape = QTabBar::RoundedSouth;
#else
    const int tabShape = 0;
#endif
    docks[QInternal::LeftDock]
        = QDockAreaLayoutInfo(&sep, QInternal::LeftDock, Qt::Vertical, tabShape, win);
    docks[QInternal::RightDock]
        = QDockAreaLayoutInfo(&sep, QInternal::RightDock, Qt::Vertical, tabShape, win);
    docks[QInternal::TopDock]
        = QDockAreaLayoutInfo(&sep, QInternal::TopDock, Qt::Horizontal, tabShape, win);
    docks[QInternal::BottomDock]
        = QDockAreaLayoutInfo(&sep, QInternal::BottomDock, Qt::Horizontal, tabShape, win);
    centralWidgetItem = nullptr;


    corners[Qt::TopLeftCorner] = Qt::TopDockWidgetArea;
    corners[Qt::TopRightCorner] = Qt::TopDockWidgetArea;
    corners[Qt::BottomLeftCorner] = Qt::BottomDockWidgetArea;
    corners[Qt::BottomRightCorner] = Qt::BottomDockWidgetArea;
}